

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesPowerGetEnergyCounter(zes_pwr_handle_t hPower,zes_power_energy_counter_t *pEnergy)

{
  zes_pfnPowerGetEnergyCounter_t pfnGetEnergyCounter;
  dditable_t *dditable;
  ze_result_t result;
  zes_power_energy_counter_t *pEnergy_local;
  zes_pwr_handle_t hPower_local;
  
  if (*(code **)(*(long *)(hPower + 8) + 0xaa0) == (code *)0x0) {
    hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPower_local._4_4_ = (**(code **)(*(long *)(hPower + 8) + 0xaa0))(*(undefined8 *)hPower,pEnergy)
    ;
  }
  return hPower_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerGetEnergyCounter(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        zes_power_energy_counter_t* pEnergy             ///< [in,out] Will contain the latest snapshot of the energy counter and
                                                        ///< timestamp when the last counter value was measured.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_pwr_object_t*>( hPower )->dditable;
        auto pfnGetEnergyCounter = dditable->zes.Power.pfnGetEnergyCounter;
        if( nullptr == pfnGetEnergyCounter )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPower = reinterpret_cast<zes_pwr_object_t*>( hPower )->handle;

        // forward to device-driver
        result = pfnGetEnergyCounter( hPower, pEnergy );

        return result;
    }